

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

int __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
::binary_search_plain_compare<S2Loop*,std::less<S2Loop*>>
          (btree_node<gtl::internal_btree::map_params<S2Loop*,std::pair<int,bool>,std::less<S2Loop*>,std::allocator<std::pair<S2Loop*const,std::pair<int,bool>>>,256,false>>
           *this,S2Loop **k,int s,int e,less<S2Loop_*> *comp)

{
  bool bVar1;
  int i;
  key_type *ppSVar2;
  int mid;
  less<S2Loop_*> *comp_local;
  int e_local;
  int s_local;
  S2Loop **k_local;
  btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
  *this_local;
  
  i = e;
  comp_local._4_4_ = s;
  while (comp_local._0_4_ = i, comp_local._4_4_ != (int)comp_local) {
    i = comp_local._4_4_ + (int)comp_local >> 1;
    ppSVar2 = btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
              ::key((btree_node<gtl::internal_btree::map_params<S2Loop_*,_std::pair<int,_bool>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::pair<int,_bool>_>_>,_256,_false>_>
                     *)this,i);
    bVar1 = std::less<S2Loop_*>::operator()(comp,*ppSVar2,*k);
    if (bVar1) {
      comp_local._4_4_ = i + 1;
      i = (int)comp_local;
    }
  }
  return comp_local._4_4_;
}

Assistant:

int binary_search_plain_compare(const K &k, int s, int e,
                                  const Compare &comp) const {
    while (s != e) {
      const int mid = (s + e) >> 1;
      if (comp(key(mid), k)) {
        s = mid + 1;
      } else {
        e = mid;
      }
    }
    return s;
  }